

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::AnyMetadata::PackFrom
          (AnyMetadata *this,Message *message,string *type_url_prefix)

{
  undefined8 *puVar1;
  internal *this_00;
  char *size;
  pointer pcVar2;
  char *size_00;
  ArenaStringPtr *this_01;
  int iVar3;
  undefined4 extraout_var;
  string *output;
  stringpiece_ssize_type in_R9;
  StringPiece message_name;
  StringPiece type_url_prefix_00;
  string local_68;
  UrlType *local_48;
  MessageLite *local_40;
  AnyMetadata *local_38;
  
  local_48 = this->type_url_;
  local_38 = this;
  InitProtobufDefaults();
  local_40 = &message->super_MessageLite;
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  puVar1 = *(undefined8 **)(CONCAT44(extraout_var,iVar3) + 8);
  this_00 = (internal *)*puVar1;
  size = (char *)puVar1[1];
  if ((long)size < 0) {
    StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
  }
  pcVar2 = (type_url_prefix->_M_dataplus)._M_p;
  size_00 = (char *)type_url_prefix->_M_string_length;
  if ((long)size_00 < 0) {
    StringPiece::LogFatalSizeTooBig((size_t)size_00,"size_t to int conversion");
  }
  message_name.length_ = (stringpiece_ssize_type)pcVar2;
  message_name.ptr_ = size;
  type_url_prefix_00.length_ = in_R9;
  type_url_prefix_00.ptr_ = size_00;
  GetTypeUrl_abi_cxx11_(&local_68,this_00,message_name,type_url_prefix_00);
  ArenaStringPtr::SetNoArena(local_48,(string *)&fixed_address_empty_string_abi_cxx11_,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  this_01 = local_38->value_;
  output = this_01->ptr_;
  if (output == (string *)&fixed_address_empty_string_abi_cxx11_) {
    ArenaStringPtr::CreateInstanceNoArena(this_01,(string *)&fixed_address_empty_string_abi_cxx11_);
    output = this_01->ptr_;
  }
  MessageLite::SerializeToString(local_40,output);
  return;
}

Assistant:

void AnyMetadata::PackFrom(const Message& message,
                           const std::string& type_url_prefix) {
  type_url_->SetNoArena(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString(),
      GetTypeUrl(message.GetDescriptor()->full_name(), type_url_prefix));
  message.SerializeToString(value_->MutableNoArena(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited()));
}